

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlScanIDAttributeDecl(xmlValidCtxtPtr ctxt,xmlElementPtr elem,int err)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  xmlValidState *pxVar4;
  
  pxVar4 = ctxt->vstateTab;
  if (pxVar4 == (xmlValidState *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      if ((*(int *)&pxVar4[3].node == 2) &&
         (iVar2 = iVar3 + 1, bVar1 = 0 < iVar3, iVar3 = iVar2, bVar1 && (int)elem != 0)) {
        __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0
                        ,ctxt,0x17,0x208,XML_ERR_ERROR,(char *)0x0,0,(char *)ctxt->warning,
                        (char *)pxVar4->exec,(char *)0x0,0,0,
                        "Element %s has too many ID attributes defined : %s\n",ctxt->warning,
                        pxVar4->exec,0);
      }
      pxVar4 = (xmlValidState *)pxVar4[3].elemDecl;
    } while (pxVar4 != (xmlValidState *)0x0);
  }
  return iVar3;
}

Assistant:

static int
xmlScanIDAttributeDecl(xmlValidCtxtPtr ctxt, xmlElementPtr elem, int err) {
    xmlAttributePtr cur;
    int ret = 0;

    if (elem == NULL) return(0);
    cur = elem->attributes;
    while (cur != NULL) {
        if (cur->atype == XML_ATTRIBUTE_ID) {
	    ret ++;
	    if ((ret > 1) && (err))
		xmlErrValidNode(ctxt, (xmlNodePtr) elem, XML_DTD_MULTIPLE_ID,
	       "Element %s has too many ID attributes defined : %s\n",
		       elem->name, cur->name, NULL);
	}
	cur = cur->nexth;
    }
    return(ret);
}